

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerMandelbrotCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerMandelbrotCase *this,
          int measurementNdx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  uint uVar5;
  pointer __dest;
  string *psVar6;
  int row;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar9;
  long lVar10;
  string *psVar11;
  long lVar12;
  uint cacheAvoidanceID;
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  *pvVar13;
  string *psVar14;
  undefined4 uVar15;
  Vector<float,_16> result;
  size_type __dnew;
  string nameSpec;
  string local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  local_108;
  UniformSpec local_e8;
  string local_80;
  undefined1 local_60 [24];
  undefined8 uStack_48;
  pointer local_40;
  pointer pUStack_38;
  
  psVar14 = &local_1a8;
  psVar11 = &local_1a8;
  psVar6 = &local_1a8;
  cacheAvoidanceID = (this->super_ShaderCompilerCase).m_startHash;
  if ((this->super_ShaderCompilerCase).m_avoidCache == true) {
    uVar5 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
    uVar5 = (uVar5 >> 4 ^ uVar5) * 0x27d4eb2d;
    cacheAvoidanceID = cacheAvoidanceID ^ uVar5 ^ uVar5 >> 0xf;
  }
  getNameSpecialization_abi_cxx11_(&local_80,(Performance *)(ulong)cacheAvoidanceID,measurementNdx);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_148._M_allocated_capacity = 0x20e;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&local_148);
  uVar4 = local_148._M_allocated_capacity;
  local_1a8.field_2._M_allocated_capacity = local_148._M_allocated_capacity;
  local_1a8._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 300 es\nuniform highp mat4 u_mvp${NAME_SPEC};\n\nin highp vec4 a_vertex${NAME_SPEC};\nin highp vec4 a_coord${NAME_SPEC};\n\nout mediump vec2 v_coord${NAME_SPEC};\n\nvoid main(void)\n{\n\tgl_Position = u_mvp${NAME_SPEC} * a_vertex${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\n\tfloat xMin = -2.0;\n\tfloat xMax = +0.5;\n\tfloat yMin = -1.5;\n\tfloat yMax = +1.5;\n\n\tv_coord${NAME_SPEC}.x = a_coord${NAME_SPEC}.x * (xMax - xMin) + xMin;\n\tv_coord${NAME_SPEC}.y = a_coord${NAME_SPEC}.y * (yMax - yMin) + yMin;\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
         ,0x20e);
  local_1a8._M_string_length = uVar4;
  __dest[uVar4] = '\0';
  specializeShaderSource(&local_e8.name,&local_1a8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
  paVar1 = &local_e8.name.field_2;
  iVar9 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.name._M_dataplus._M_p,local_e8.name.field_2._M_allocated_capacity + 1);
    iVar9 = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    iVar9 = extraout_EDX_01;
  }
  mandelbrotFragmentTemplate_abi_cxx11_
            (&local_1a8,(Performance *)(ulong)(uint)this->m_numFractalIterations,iVar9);
  specializeShaderSource(&local_e8.name,&local_1a8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.name._M_dataplus._M_p,local_e8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = (pointer)0x0;
  local_168._16_8_ = (pointer)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
                 "a_vertex",&local_80);
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_40 = (pointer)0x3f800000bf800000;
  pUStack_38 = (pointer)0x3f80000000000000;
  local_60._16_8_ = (pointer)0xbf8000003f800000;
  uStack_48 = 0x3f80000000000000;
  local_60._0_8_ = &DAT_3f8000003f800000;
  local_60._8_8_ = (pointer)0x3f80000000000000;
  local_1a8._M_dataplus._M_p = (pointer)0x0;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_allocated_capacity = 0;
  local_1a8.field_2._8_8_ = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  lVar10 = 0;
  do {
    iVar9 = (int)lVar10;
    pvVar13 = &local_108;
    if (((iVar9 != 0) &&
        (pvVar13 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)&local_40, iVar9 != 1)) &&
       (pvVar13 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                   *)local_60, iVar9 == 2)) {
      pvVar13 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                 *)(local_60 + 0x10);
    }
    uVar15 = *(undefined4 *)
              ((long)&(pvVar13->
                      super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4);
    uVar2 = *(undefined4 *)
             &(pvVar13->
              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = *(undefined4 *)
             ((long)&(pvVar13->
                     super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                     )._M_impl.super__Vector_impl_data._M_finish + 4);
    *(undefined4 *)psVar14 =
         *(undefined4 *)
          &(pvVar13->
           super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
           )._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)psVar14 + 4) = uVar15;
    *(undefined4 *)((long)psVar14 + 8) = uVar2;
    *(undefined4 *)((long)psVar14 + 0xc) = uVar3;
    lVar10 = lVar10 + 1;
    psVar14 = (string *)((long)psVar14 + 0x10);
  } while (lVar10 != 4);
  local_e8.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_148._M_allocated_capacity,
             local_148._8_8_ + local_148._M_allocated_capacity);
  local_e8.value.m_data[0xb] = (float)local_178;
  local_e8.value.m_data[0xc] = (float)((ulong)local_178 >> 0x20);
  local_e8.value.m_data[0xd] = (float)uStack_170;
  local_e8.value.m_data[0xe] = (float)((ulong)uStack_170 >> 0x20);
  local_e8.value.m_data[7] = (float)local_188;
  local_e8.value.m_data[8] = (float)((ulong)local_188 >> 0x20);
  local_e8.value.m_data[9] = (float)uStack_180;
  local_e8.value.m_data[10] = (float)((ulong)uStack_180 >> 0x20);
  local_e8.value.m_data[3] = (float)local_1a8.field_2._M_allocated_capacity;
  local_e8.value.m_data[4] = (float)((ulong)local_1a8.field_2._0_8_ >> 0x20);
  local_e8.value.m_data[5] = (float)local_1a8.field_2._8_8_;
  local_e8.value.m_data[6] = (float)((ulong)local_1a8.field_2._8_8_ >> 0x20);
  local_e8.type = (Type)local_1a8._M_dataplus._M_p;
  local_e8.value.m_data[0] = (float)((ulong)local_1a8._M_dataplus._M_p >> 0x20);
  local_e8.value.m_data[1] = (float)local_1a8._M_string_length;
  local_e8.value.m_data[2] = (float)(local_1a8._M_string_length >> 0x20);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_168,(AttribSpec *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.name._M_dataplus._M_p,local_e8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != &local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
  }
  paVar8 = &local_148;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar8,
                 "a_coord",&local_80);
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0;
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_40 = (pointer)0x3f80000000000000;
  pUStack_38 = (pointer)0x3f80000000000000;
  local_60._16_8_ = (pointer)0x3f800000;
  uStack_48 = 0x3f80000000000000;
  local_60._0_8_ = &DAT_3f8000003f800000;
  local_60._8_8_ = (pointer)0x3f80000000000000;
  local_1a8._M_dataplus._M_p = (pointer)0x0;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_allocated_capacity = 0;
  local_1a8.field_2._8_8_ = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  lVar10 = 0;
  do {
    iVar9 = (int)lVar10;
    pvVar13 = &local_108;
    if (((iVar9 != 0) &&
        (pvVar13 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)&local_40, iVar9 != 1)) &&
       (pvVar13 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                   *)local_60, iVar9 == 2)) {
      pvVar13 = (vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                 *)(local_60 + 0x10);
    }
    uVar15 = *(undefined4 *)
              ((long)&(pvVar13->
                      super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4);
    uVar2 = *(undefined4 *)
             &(pvVar13->
              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar3 = *(undefined4 *)
             ((long)&(pvVar13->
                     super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                     )._M_impl.super__Vector_impl_data._M_finish + 4);
    *(undefined4 *)psVar11 =
         *(undefined4 *)
          &(pvVar13->
           super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
           )._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)psVar11 + 4) = uVar15;
    *(undefined4 *)((long)psVar11 + 8) = uVar2;
    *(undefined4 *)((long)psVar11 + 0xc) = uVar3;
    lVar10 = lVar10 + 1;
    psVar11 = (string *)((long)psVar11 + 0x10);
  } while (lVar10 != 4);
  local_e8.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_148._M_allocated_capacity,
             local_148._8_8_ + local_148._M_allocated_capacity);
  local_e8.value.m_data[0xb] = (float)local_178;
  local_e8.value.m_data[0xc] = (float)((ulong)local_178 >> 0x20);
  local_e8.value.m_data[0xd] = (float)uStack_170;
  local_e8.value.m_data[0xe] = (float)((ulong)uStack_170 >> 0x20);
  local_e8.value.m_data[7] = (float)local_188;
  local_e8.value.m_data[8] = (float)((ulong)local_188 >> 0x20);
  local_e8.value.m_data[9] = (float)uStack_180;
  local_e8.value.m_data[10] = (float)((ulong)uStack_180 >> 0x20);
  local_e8.value.m_data[3] = (float)local_1a8.field_2._M_allocated_capacity;
  local_e8.value.m_data[4] = (float)((ulong)local_1a8.field_2._0_8_ >> 0x20);
  local_e8.value.m_data[5] = (float)local_1a8.field_2._8_8_;
  local_e8.value.m_data[6] = (float)((ulong)local_1a8.field_2._8_8_ >> 0x20);
  local_e8.type = (Type)local_1a8._M_dataplus._M_p;
  local_e8.value.m_data[0] = (float)((ulong)local_1a8._M_dataplus._M_p >> 0x20);
  local_e8.value.m_data[1] = (float)local_1a8._M_string_length;
  local_e8.value.m_data[2] = (float)(local_1a8._M_string_length >> 0x20);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_168,(AttribSpec *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.name._M_dataplus._M_p,local_e8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_allocated_capacity != &local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138._M_allocated_capacity + 1);
  }
  local_e8.name._M_dataplus._M_p =
       (pointer)(__return_storage_ptr__->vertexAttributes).
                super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_e8.name._M_string_length =
       (size_type)
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e8.name.field_2._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_168._0_8_;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_168._8_8_;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_168._16_8_;
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = (pointer)0x0;
  local_168._16_8_ = (pointer)0x0;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)&local_e8);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_168);
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 "u_mvp",&local_80);
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138._M_allocated_capacity = 0;
  local_138._8_8_ = 0;
  local_148._M_allocated_capacity = 0;
  local_148._8_8_ = 0;
  lVar10 = 0;
  lVar7 = 0;
  do {
    lVar12 = 0;
    do {
      uVar15 = 0x3f800000;
      if (lVar10 != lVar12) {
        uVar15 = 0;
      }
      *(undefined4 *)((long)paVar8 + lVar12) = uVar15;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    lVar7 = lVar7 + 1;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar8 + 4);
    lVar10 = lVar10 + 0x10;
  } while (lVar7 != 4);
  paVar8 = &local_148;
  lVar10 = 0;
  do {
    lVar7 = 0;
    do {
      *(undefined4 *)((long)psVar6 + lVar7) = *(undefined4 *)((long)paVar8 + lVar7);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x10);
    lVar10 = lVar10 + 1;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar8->_M_allocated_capacity + 2);
    psVar6 = (string *)((long)psVar6 + 0x10);
  } while (lVar10 != 4);
  local_e8.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_168._0_8_,
             (pointer)(local_168._0_8_ +
                      (long)((Vector<float,_16> *)(local_168._8_8_ + 0x20) + -1) + 0x20));
  local_e8.type = TYPE_MAT4;
  local_e8.value.m_data[0] = SUB84(local_1a8._M_dataplus._M_p,0);
  local_e8.value.m_data[1] = (float)((ulong)local_1a8._M_dataplus._M_p >> 0x20);
  local_e8.value.m_data[2] = (float)local_1a8._M_string_length;
  local_e8.value.m_data[3] = (float)(local_1a8._M_string_length >> 0x20);
  local_e8.value.m_data[4] = (float)local_1a8.field_2._M_allocated_capacity;
  local_e8.value.m_data[5] = (float)((ulong)local_1a8.field_2._0_8_ >> 0x20);
  local_e8.value.m_data[6] = (float)local_1a8.field_2._8_8_;
  local_e8.value.m_data[7] = (float)((ulong)local_1a8.field_2._8_8_ >> 0x20);
  local_e8.value.m_data[8] = (float)local_188;
  local_e8.value.m_data[9] = (float)((ulong)local_188 >> 0x20);
  local_e8.value.m_data[10] = (float)uStack_180;
  local_e8.value.m_data[0xb] = (float)((ulong)uStack_180 >> 0x20);
  local_e8.value.m_data[0xc] = (float)local_178;
  local_e8.value.m_data[0xd] = (float)((ulong)local_178 >> 0x20);
  local_e8.value.m_data[0xe] = (float)uStack_170;
  local_e8.value.m_data[0xf] = (float)((ulong)uStack_170 >> 0x20);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>(&local_108,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.name._M_dataplus._M_p,
                    (ulong)(local_e8.name.field_2._M_allocated_capacity + 1));
  }
  if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
  }
  local_e8.name._M_dataplus._M_p =
       (pointer)(__return_storage_ptr__->uniforms).
                super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_e8.name._M_string_length =
       (size_type)
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e8.name.field_2._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_108.
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_108.
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.
       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             *)&local_e8);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerMandelbrotCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource = specializeShaderSource(mandelbrotVertexTemplate(), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource = specializeShaderSource(mandelbrotFragmentTemplate(m_numFractalIterations), specID, SHADER_VALIDITY_VALID);

	result.vertexAttributes = mandelbrotShaderAttributes(nameSpec);
	result.uniforms = mandelbrotShaderUniforms(nameSpec);

	return result;
}